

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-impl-test.cc
# Opt level: O0

void __thiscall FPTest_Normalize_Test::TestBody(FPTest_Normalize_Test *this)

{
  undefined1 uVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  fp v;
  AssertHelper *in_stack_ffffffffffffff50;
  unsigned_long *in_stack_ffffffffffffff58;
  AssertionResult *pAVar3;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  char *in_stack_ffffffffffffff68;
  int line;
  fp *this_01;
  Type type;
  undefined7 in_stack_ffffffffffffff80;
  AssertionResult local_60 [2];
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *this_02;
  AssertionResult local_28;
  fp local_18;
  
  this_01 = &local_18;
  fmt::v5::internal::fp::fp(this_01,0xbeef,0x2a);
  fmt::v5::internal::fp::normalize<0>(this_01);
  this_02 = (AssertHelper *)0xbeef000000000000;
  pAVar3 = &local_28;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            (in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,(unsigned_long *)in_stack_ffffffffffffff50);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  type = (Type)((ulong)pAVar3 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff80));
    in_stack_ffffffffffffff68 =
         testing::AssertionResult::failure_message((AssertionResult *)0x10ea32);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff80),type,(char *)this_01,
               (int)((ulong)in_stack_ffffffffffffff68 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    testing::internal::AssertHelper::operator=(this_02,in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
    testing::Message::~Message((Message *)0x10ea80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10eac9);
  pAVar3 = local_60;
  testing::internal::EqHelper<false>::Compare<int,int>
            (in_stack_ffffffffffffff68,
             (char *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),(int *)pAVar3,
             (int *)in_stack_ffffffffffffff50);
  line = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar3);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)CONCAT17(uVar1,in_stack_ffffffffffffff80));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x10eb58)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff80),type,(char *)this_01,line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffff60));
    testing::internal::AssertHelper::operator=(this_02,in_stack_ffffffffffffffc8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x10eba6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ebec);
  return;
}

Assistant:

TEST(FPTest, Normalize) {
  auto v = fp(0xbeef, 42);
  v.normalize();
  EXPECT_EQ(0xbeef000000000000, v.f);
  EXPECT_EQ(-6, v.e);
}